

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Connection *conn)

{
  Module *pMVar1;
  optional<unsigned_long> oVar2;
  optional<long> oVar3;
  _Storage<unsigned_long,_true> local_d0;
  _Storage<long,_true> local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  _Storage<unsigned_long,_true> local_b8;
  undefined1 uStack_b0;
  undefined7 uStack_af;
  string local_a8;
  _Storage<unsigned_long,_true> local_88;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  string local_78;
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  undefined1 local_40 [40];
  Connection *c;
  Connection *conn_local;
  HEARTGenerator *this_local;
  
  c = (Connection *)conn;
  conn_local = (Connection *)this;
  local_40._32_8_ =
       Module::allocate<soul::heart::Connection,soul::CodeLocation&>
                 (this->module,&(conn->super_ASTObject).context.location);
  pMVar1 = this->module;
  pool_ref<soul::heart::Connection>::pool_ref<soul::heart::Connection,void>
            ((pool_ref<soul::heart::Connection> *)(local_40 + 0x18),(Connection *)local_40._32_8_);
  std::
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ::push_back(&pMVar1->connections,(pool_ref<soul::heart::Connection> *)(local_40 + 0x18));
  pool_ref<soul::heart::Connection>::~pool_ref
            ((pool_ref<soul::heart::Connection> *)(local_40 + 0x18));
  AST::Connection::getSourceProcessor((Connection *)(local_50 + 8));
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_40,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (((EndpointReference *)(local_40._32_8_ + 0x18))->processor).object =
       (ProcessorInstance *)local_40._0_8_;
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)local_40);
  pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::AST::ProcessorInstance> *)(local_50 + 8));
  AST::Connection::getDestProcessor((Connection *)local_58);
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_50,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (((EndpointReference *)(local_40._32_8_ + 0x60))->processor).object =
       (ProcessorInstance *)local_50._0_8_;
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)local_50);
  pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::AST::ProcessorInstance> *)local_58);
  AST::Connection::getSourceEndpointName_abi_cxx11_(&local_78,(Connection *)c);
  std::__cxx11::string::operator=
            ((string *)&((EndpointReference *)(local_40._32_8_ + 0x18))->endpointName,
             (string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  oVar2 = AST::Connection::getSourceEndpointIndex((Connection *)c);
  local_88._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uStack_80 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  (((EndpointReference *)(local_40._32_8_ + 0x18))->endpointIndex).
  super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)local_88;
  *(ulong *)&(((EndpointReference *)(local_40._32_8_ + 0x18))->endpointIndex).
             super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged = CONCAT71(uStack_7f,uStack_80);
  AST::Connection::getDestEndpointName_abi_cxx11_(&local_a8,(Connection *)c);
  std::__cxx11::string::operator=
            ((string *)&((EndpointReference *)(local_40._32_8_ + 0x60))->endpointName,
             (string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  oVar2 = AST::Connection::getDestEndpointIndex((Connection *)c);
  local_b8._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uStack_b0 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  (((EndpointReference *)(local_40._32_8_ + 0x60))->endpointIndex).
  super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)local_b8;
  *(ulong *)&(((EndpointReference *)(local_40._32_8_ + 0x60))->endpointIndex).
             super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged = CONCAT71(uStack_af,uStack_b0);
  *(InterpolationType *)(local_40._32_8_ + 0xa8) =
       (InterpolationType)(c->source).endpointName._M_string_length;
  local_d0 = (c->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
  oVar3 = getDelayLength((pool_ptr<soul::AST::Expression> *)&local_d0);
  local_c8._M_value =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_c0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  (((optional<long> *)(local_40._32_8_ + 0xb0))->super__Optional_base<long,_true,_true>)._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)local_c8;
  *(ulong *)&(((optional<long> *)(local_40._32_8_ + 0xb0))->super__Optional_base<long,_true,_true>).
             _M_payload.super__Optional_payload_base<long>._M_engaged = CONCAT71(uStack_bf,local_c0)
  ;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&local_d0);
  return;
}

Assistant:

void visit (AST::Connection& conn) override
    {
        auto& c = module.allocate<heart::Connection> (conn.context.location);
        module.connections.push_back (c);

        c.source.processor      = getOrAddProcessorInstance (conn.getSourceProcessor());
        c.dest.processor        = getOrAddProcessorInstance (conn.getDestProcessor());
        c.source.endpointName   = conn.getSourceEndpointName();
        c.source.endpointIndex  = conn.getSourceEndpointIndex();
        c.dest.endpointName     = conn.getDestEndpointName();
        c.dest.endpointIndex    = conn.getDestEndpointIndex();
        c.interpolationType     = conn.interpolationType;
        c.delayLength           = getDelayLength (conn.delayLength);
    }